

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptorProto::InternalSwap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  ArenaStringPtr *pAVar2;
  uint32 uVar3;
  string *psVar4;
  MethodOptions *pMVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  UnknownFieldSet *other_00;
  Arena *pAVar9;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      other_00 = internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pAVar1 = &this->name_;
  pAVar9 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) {
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->name_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a3c74;
    }
  }
  else {
LAB_002a3c74:
    psVar4 = pAVar1->ptr_;
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar4);
  }
  pAVar1 = &this->input_type_;
  pAVar9 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) {
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->input_type_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a3cca;
    }
  }
  else {
LAB_002a3cca:
    psVar4 = pAVar1->ptr_;
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar4);
  }
  pAVar1 = &this->output_type_;
  pAVar9 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) {
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->output_type_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_002a3d4f;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar4 = pAVar1->ptr_;
  if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar2,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar4);
LAB_002a3d4f:
  pMVar5 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar5;
  bVar7 = this->client_streaming_;
  bVar8 = this->server_streaming_;
  bVar6 = other->server_streaming_;
  this->client_streaming_ = other->client_streaming_;
  this->server_streaming_ = bVar6;
  other->client_streaming_ = bVar7;
  other->server_streaming_ = bVar8;
  return;
}

Assistant:

void MethodDescriptorProto::InternalSwap(MethodDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  input_type_.Swap(&other->input_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  output_type_.Swap(&other->output_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(MethodDescriptorProto, server_streaming_)
      + sizeof(MethodDescriptorProto::server_streaming_)
      - PROTOBUF_FIELD_OFFSET(MethodDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}